

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

ostream * std::operator<<(ostream *os,vector<char,_std::allocator<char>_> *vec)

{
  char *pcVar1;
  ostream *poVar2;
  char *item;
  char *pcVar3;
  
  pcVar1 = (vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pcVar3 = (vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start; pcVar3 != pcVar1; pcVar3 = pcVar3 + 1) {
    poVar2 = std::operator<<(os,*pcVar3);
    std::operator<<(poVar2,", ");
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<T>& vec)
{
  for (auto const& item : vec)
  {
    os << item << ", ";
  }
  return os;
}